

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uparse.cpp
# Opt level: O0

int32_t u_parseCodePointRange(char *s,uint32_t *pStart,uint32_t *pEnd,UErrorCode *pErrorCode)

{
  UBool UVar1;
  int32_t iVar2;
  char *pcVar3;
  char *pcStack_38;
  int32_t rangeLength;
  char *terminator;
  UErrorCode *pErrorCode_local;
  uint32_t *pEnd_local;
  uint32_t *pStart_local;
  char *s_local;
  
  terminator = (char *)pErrorCode;
  pErrorCode_local = (UErrorCode *)pEnd;
  pEnd_local = pStart;
  pStart_local = (uint32_t *)s;
  iVar2 = u_parseCodePointRangeAnyTerminator(s,pStart,pEnd,&stack0xffffffffffffffc8,pErrorCode);
  UVar1 = U_SUCCESS(*(UErrorCode *)terminator);
  s_local._4_4_ = iVar2;
  if (((UVar1 != '\0') && (pcVar3 = u_skipWhitespace(pcStack_38), *pcVar3 != ';')) &&
     (*pcVar3 != '\0')) {
    terminator[0] = '\t';
    terminator[1] = '\0';
    terminator[2] = '\0';
    terminator[3] = '\0';
    s_local._4_4_ = 0;
  }
  return s_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_parseCodePointRange(const char *s,
                      uint32_t *pStart, uint32_t *pEnd,
                      UErrorCode *pErrorCode) {
    const char *terminator;
    int32_t rangeLength=
        u_parseCodePointRangeAnyTerminator(s, pStart, pEnd, &terminator, pErrorCode);
    if(U_SUCCESS(*pErrorCode)) {
        terminator=u_skipWhitespace(terminator);
        if(*terminator!=';' && *terminator!=0) {
            *pErrorCode=U_PARSE_ERROR;
            return 0;
        }
    }
    return rangeLength;
}